

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
_set_selector<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
          *other,true_type *param_2)

{
  double *pdVar1;
  DenseIndex size_00;
  ulong uVar2;
  double dVar3;
  Index size;
  undefined8 *puVar4;
  Index index;
  ulong uVar5;
  long lVar6;
  Matrix<double,__1,_1,_0,__1,_1> *other_1;
  DenseStorage<double,__1,__1,_1,_0> local_28;
  
  size_00 = (((other->
              super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              ).m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
  DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_28,size_00,size_00,1);
  uVar2 = (((other->
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            ).m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if ((long)uVar2 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_28.m_rows != uVar2) {
    free(local_28.m_data);
    if (uVar2 == 0) {
      local_28.m_data = (double *)0x0;
    }
    else if ((uVar2 >> 0x3d != 0) ||
            (local_28.m_data = (double *)malloc(uVar2 * 8), local_28.m_data == (double *)0x0)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = operator_delete;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_28.m_rows = uVar2;
  MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  lazyAssign<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_28,
             &other->
              super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            );
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,local_28.m_rows,1);
  uVar2 = *(ulong *)(this + 8);
  if (uVar2 != local_28.m_rows) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar5 = uVar2 - ((long)uVar2 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar2) {
    lVar6 = 0;
    do {
      dVar3 = (local_28.m_data + lVar6)[1];
      pdVar1 = (double *)(*(long *)this + lVar6 * 8);
      *pdVar1 = local_28.m_data[lVar6];
      pdVar1[1] = dVar3;
      lVar6 = lVar6 + 2;
    } while (lVar6 < (long)uVar5);
  }
  if ((long)uVar5 < (long)uVar2) {
    lVar6 = *(long *)this;
    do {
      *(double *)(lVar6 + uVar5 * 8) = local_28.m_data[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  free(local_28.m_data);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void _set_selector(const OtherDerived& other, const internal::true_type&) { _set_noalias(other.eval()); }